

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::
GeneratedMessageReflection_UnvalidatedStringsAreDowngradedToBytes_Test::TestBody
          (GeneratedMessageReflection_UnvalidatedStringsAreDowngradedToBytes_Test *this)

{
  TestAllExtensions *pTVar1;
  TestAllExtensions *other;
  Message *in_RCX;
  string_view input;
  allocator<char> local_89;
  string local_88;
  TestChildExtension msg;
  TestChildExtension parsed_msg;
  
  proto2_unittest::TestChildExtension::TestChildExtension(&parsed_msg);
  input._M_str = (char *)&parsed_msg;
  input._M_len = (size_t)
                 "\n        optional_extension <\n          [proto2_unittest.repeated_string_extension]: \"foo\"\n        >\n      "
  ;
  TextFormat::ParseFromString((TextFormat *)0x6b,input,in_RCX);
  proto2_unittest::TestChildExtension::TestChildExtension(&msg);
  pTVar1 = proto2_unittest::TestChildExtension::mutable_optional_extension(&msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"bar",&local_89);
  proto2_unittest::TestAllExtensions::
  AddExtension<google::protobuf::internal::RepeatedStringTypeTraits,(unsigned_char)12,false>
            (pTVar1,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedStringTypeTraits,_(unsigned_char)__f_,_false>
                     *)proto2_unittest::repeated_string_extension,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  pTVar1 = proto2_unittest::TestChildExtension::mutable_optional_extension(&parsed_msg);
  other = proto2_unittest::TestChildExtension::mutable_optional_extension(&msg);
  proto2_unittest::TestAllExtensions::Swap(pTVar1,other);
  proto2_unittest::TestChildExtension::~TestChildExtension(&msg);
  proto2_unittest::TestChildExtension::~TestChildExtension(&parsed_msg);
  return;
}

Assistant:

TEST(GeneratedMessageReflection, UnvalidatedStringsAreDowngradedToBytes) {
  proto2_unittest::TestChildExtension parsed_msg;
  google::protobuf::TextFormat::ParseFromString(
      R"pb(
        optional_extension <
          [proto2_unittest.repeated_string_extension]: "foo"
        >
      )pb",
      &parsed_msg);
  proto2_unittest::TestChildExtension msg;
  msg.mutable_optional_extension()->AddExtension(
      proto2_unittest::repeated_string_extension, "bar");
  parsed_msg.mutable_optional_extension()->Swap(
      msg.mutable_optional_extension());
}